

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

int SafeDecodeCommandBlockSwitch(BrotliDecoderStateInternal *s)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  HuffmanCode *table;
  BrotliBitReader *br_00;
  bool bVar4;
  BrotliDecoderStateInternal *s_local;
  uint local_414;
  uint64_t local_410;
  BrotliBitReaderState memento;
  uint32_t block_type;
  uint32_t *ringbuffer;
  BrotliBitReader *br;
  HuffmanCode *len_tree;
  HuffmanCode *type_tree;
  uint32_t max_block_type;
  uint local_3a8;
  uint32_t nbits_5;
  uint32_t bits;
  uint32_t index;
  HuffmanCode *local_398;
  uint32_t *local_390;
  BrotliDecoderStateInternal *local_388;
  uint local_30c;
  uint32_t *puStack_308;
  uint32_t val_2;
  BrotliBitReader *local_300;
  HuffmanCode *local_2f8;
  int local_2ec;
  uint *local_2e8;
  undefined4 local_2dc;
  BrotliBitReader *local_2d8;
  int local_2cc;
  undefined4 local_2c8;
  uint32_t local_2c4;
  BrotliBitReader *local_2c0;
  BrotliBitReader *local_2b8;
  BrotliBitReader *local_2b0;
  uint local_2a8;
  uint local_2a4;
  uint32_t *puStack_2a0;
  uint32_t val_1;
  BrotliBitReader *local_298;
  HuffmanCode *local_290;
  int local_284;
  uint *local_280;
  undefined4 local_274;
  BrotliBitReader *local_270;
  int local_264;
  undefined4 local_260;
  uint32_t local_25c;
  BrotliBitReader *local_258;
  BrotliBitReader *local_250;
  BrotliBitReader *local_248;
  uint local_240;
  uint local_23c;
  BrotliBitReader *pBStack_238;
  uint32_t nbits_3;
  HuffmanCode *local_230;
  uint local_228;
  uint local_224;
  uint local_220;
  uint local_21c;
  BrotliBitReader *local_218;
  undefined4 local_20c;
  BrotliBitReader *local_208;
  uint32_t nbits_4;
  HuffmanCode *local_1f0;
  uint32_t nbits;
  uint32_t nbits_1;
  uint32_t code;
  uint32_t nbits_2;
  uint64_t *local_108;
  BrotliBitReader *local_100;
  uint32_t val;
  
  uVar2 = s->num_block_types[1];
  local_290 = s->block_type_trees + 0x278;
  table = s->block_len_trees + 0x18c;
  br_00 = &s->br;
  local_108 = &local_410;
  local_410 = br_00->val_;
  memento.val_._0_4_ = (s->br).bit_pos_;
  memento._8_8_ = (s->br).next_in;
  memento.next_in = (uint8_t *)(s->br).avail_in;
  puStack_2a0 = (uint32_t *)((long)&memento.avail_in + 4);
  local_274 = 0xf;
  local_280 = &local_2a4;
  do {
    if (0xe < 0x40 - (s->br).bit_pos_) {
      local_260 = 0xf;
      local_25c = 0x7fff;
      local_2a4 = (uint)(br_00->val_ >> ((byte)(s->br).bit_pos_ & 0x3f)) & 0x7fff;
      local_264 = 1;
      local_250 = br_00;
      goto LAB_00114cf7;
    }
    bVar4 = (s->br).avail_in != 0;
    if (bVar4) {
      br_00->val_ = br_00->val_ >> 8;
      br_00->val_ = (ulong)*(s->br).next_in << 0x38 | br_00->val_;
      (s->br).bit_pos_ = (s->br).bit_pos_ - 8;
      (s->br).avail_in = (s->br).avail_in - 1;
      (s->br).next_in = (s->br).next_in + 1;
    }
    local_240 = (uint)bVar4;
    local_248 = br_00;
  } while (local_240 != 0);
  local_264 = 0;
LAB_00114cf7:
  local_298 = br_00;
  local_270 = br_00;
  local_258 = br_00;
  local_100 = br_00;
  if (local_264 == 0) {
    local_284 = SafeDecodeSymbol(local_290,br_00,puStack_2a0);
  }
  else {
    local_228 = local_2a4;
    local_230 = local_290 + (local_2a4 & 0xff);
    if (8 < local_230->bits) {
      local_23c = local_230->bits - 8;
      local_20c = 8;
      (s->br).bit_pos_ = (s->br).bit_pos_ + 8;
      local_220 = kBitMask[local_23c];
      local_230 = local_230 +
                  (long)(int)(uint)local_230->value + (ulong)(local_2a4 >> 8 & local_220);
      local_224 = local_23c;
      local_208 = br_00;
    }
    local_21c = (uint)local_230->bits;
    (s->br).bit_pos_ = local_21c + (s->br).bit_pos_;
    memento.avail_in._4_4_ = (uint32_t)local_230->value;
    local_284 = 1;
    pBStack_238 = br_00;
    local_218 = br_00;
  }
  if (local_284 == 0) {
    bVar4 = false;
    goto LAB_001155fc;
  }
  local_390 = s->block_length + 1;
  _bits = br_00;
  local_388 = s;
  if (s->substate_read_block_length == BROTLI_STATE_READ_BLOCK_LENGTH_NONE) {
    puStack_308 = &nbits_5;
    local_2dc = 0xf;
    local_2e8 = &local_30c;
    do {
      if (0xe < 0x40 - (s->br).bit_pos_) {
        local_2c8 = 0xf;
        local_2c4 = 0x7fff;
        local_30c = (uint)(br_00->val_ >> ((byte)(s->br).bit_pos_ & 0x3f)) & 0x7fff;
        local_2cc = 1;
        local_2b8 = br_00;
        goto LAB_001150a4;
      }
      bVar4 = (s->br).avail_in != 0;
      if (bVar4) {
        br_00->val_ = br_00->val_ >> 8;
        br_00->val_ = (ulong)*(s->br).next_in << 0x38 | br_00->val_;
        (s->br).bit_pos_ = (s->br).bit_pos_ - 8;
        (s->br).avail_in = (s->br).avail_in - 1;
        (s->br).next_in = (s->br).next_in + 1;
      }
      local_2a8 = (uint)bVar4;
      local_2b0 = br_00;
    } while (local_2a8 != 0);
    local_2cc = 0;
LAB_001150a4:
    if (local_2cc == 0) {
      local_398 = table;
      local_300 = br_00;
      local_2f8 = table;
      local_2d8 = br_00;
      local_2c0 = br_00;
      local_2ec = SafeDecodeSymbol(table,br_00,puStack_308);
    }
    else {
      local_1f0 = table + (local_30c & 0xff);
      if (8 < local_1f0->bits) {
        bVar1 = local_1f0->bits;
        (s->br).bit_pos_ = (s->br).bit_pos_ + 8;
        local_1f0 = local_1f0 +
                    (long)(int)(uint)local_1f0->value +
                    (ulong)(local_30c >> 8 & kBitMask[bVar1 - 8]);
      }
      (s->br).bit_pos_ = (uint)local_1f0->bits + (s->br).bit_pos_;
      nbits_5 = (uint32_t)local_1f0->value;
      local_2ec = 1;
    }
    if (local_2ec != 0) goto LAB_0011526a;
    bVar4 = false;
  }
  else {
    nbits_5 = s->block_length_index;
LAB_0011526a:
    uVar3 = (uint)kBlockLengthPrefixCode[nbits_5].nbits;
    while (0x40 - _bits->bit_pos_ < uVar3) {
      if (_bits->avail_in == 0) {
        bVar4 = false;
        goto LAB_0011544f;
      }
      _bits->val_ = _bits->val_ >> 8;
      _bits->val_ = (ulong)*_bits->next_in << 0x38 | _bits->val_;
      _bits->bit_pos_ = _bits->bit_pos_ - 8;
      _bits->avail_in = _bits->avail_in - 1;
      _bits->next_in = _bits->next_in + 1;
    }
    local_3a8 = (uint)(_bits->val_ >> ((byte)_bits->bit_pos_ & 0x3f)) & kBitMask[uVar3];
    _bits->bit_pos_ = uVar3 + _bits->bit_pos_;
    bVar4 = true;
LAB_0011544f:
    if (bVar4) {
      *local_390 = kBlockLengthPrefixCode[nbits_5].offset + local_3a8;
      local_388->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
      bVar4 = true;
    }
    else {
      local_388->block_length_index = nbits_5;
      local_388->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_SUFFIX;
      bVar4 = false;
    }
  }
  if (bVar4) {
    if (memento.avail_in._4_4_ == 1) {
      memento.avail_in._4_4_ = s->block_type_rb[3] + 1;
    }
    else if (memento.avail_in._4_4_ == 0) {
      memento.avail_in._4_4_ = s->block_type_rb[2];
    }
    else {
      memento.avail_in._4_4_ = memento.avail_in._4_4_ - 2;
    }
    if (uVar2 <= memento.avail_in._4_4_) {
      memento.avail_in._4_4_ = memento.avail_in._4_4_ - uVar2;
    }
    s->block_type_rb[2] = s->block_type_rb[3];
    s->block_type_rb[3] = memento.avail_in._4_4_;
    bVar4 = true;
  }
  else {
    s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
    br_00->val_ = local_410;
    (s->br).bit_pos_ = (uint32_t)memento.val_;
    (s->br).next_in = (uint8_t *)memento._8_8_;
    (s->br).avail_in = (size_t)memento.next_in;
    bVar4 = false;
  }
LAB_001155fc:
  if (bVar4) {
    s->htree_command = (s->insert_copy_hgroup).htrees[s->block_type_rb[3]];
  }
  local_414 = (uint)bVar4;
  return local_414;
}

Assistant:

static BROTLI_BOOL BROTLI_NOINLINE SafeDecodeCommandBlockSwitch(
    BrotliDecoderState* s) {
  return DecodeCommandBlockSwitchInternal(1, s);
}